

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int populate_description_metadata(MMDB_s *mmdb,MMDB_s *metadata_db,MMDB_entry_s *metadata_start)

{
  long lVar1;
  int iVar2;
  MMDB_description_s **ppMVar3;
  MMDB_description_s *pMVar4;
  char *pcVar5;
  MMDB_entry_data_list_s *pMVar6;
  size_t sVar7;
  ulong __nmemb;
  MMDB_entry_data_list_s *pMVar8;
  MMDB_entry_data_s entry_data;
  MMDB_entry_s map_start;
  MMDB_entry_data_list_s *local_88;
  MMDB_entry_data_list_s *local_80;
  MMDB_entry_data_s local_78;
  MMDB_entry_s local_40;
  
  iVar2 = MMDB_aget_value(metadata_start,&local_78,&PTR_anon_var_dwarf_1c12_00108dc0);
  if ((iVar2 == 0) && (iVar2 = 3, local_78.type == 7)) {
    local_40.offset = local_78.offset;
    local_40.mmdb = metadata_db;
    iVar2 = MMDB_get_entry_data_list(&local_40,&local_88);
    pMVar8 = local_88;
    if (iVar2 == 0) {
      __nmemb = (ulong)(local_88->entry_data).data_size;
      (mmdb->metadata).description.count = 0;
      if (__nmemb == 0) {
        (mmdb->metadata).description.descriptions = (MMDB_description_s **)0x0;
        iVar2 = 0;
      }
      else {
        ppMVar3 = (MMDB_description_s **)calloc(__nmemb,8);
        (mmdb->metadata).description.descriptions = ppMVar3;
        if (ppMVar3 == (MMDB_description_s **)0x0) {
          iVar2 = 5;
        }
        else {
          local_80 = pMVar8;
          sVar7 = 1;
          iVar2 = 5;
          pMVar6 = local_88;
          do {
            local_88 = pMVar6;
            if (sVar7 - __nmemb == 1) {
              iVar2 = 0;
              pMVar8 = local_80;
              break;
            }
            pMVar4 = (MMDB_description_s *)calloc(1,0x10);
            (mmdb->metadata).description.descriptions[sVar7 - 1] = pMVar4;
            ppMVar3 = (mmdb->metadata).description.descriptions;
            pMVar4 = ppMVar3[sVar7 - 1];
            pMVar8 = local_80;
            if (pMVar4 == (MMDB_description_s *)0x0) break;
            (mmdb->metadata).description.count = sVar7;
            pMVar4->language = (char *)0x0;
            ppMVar3[sVar7 - 1]->description = (char *)0x0;
            pMVar6 = pMVar6->next;
            if ((pMVar6->entry_data).type != 2) {
LAB_001052d8:
              iVar2 = 3;
              pMVar8 = local_80;
              local_88 = pMVar6;
              break;
            }
            pcVar5 = mmdb_strndup((pMVar6->entry_data).field_1.utf8_string,
                                  (ulong)(pMVar6->entry_data).data_size);
            ppMVar3 = (mmdb->metadata).description.descriptions;
            ppMVar3[sVar7 - 1]->language = pcVar5;
            pMVar8 = local_80;
            local_88 = pMVar6;
            if (ppMVar3[sVar7 - 1]->language == (char *)0x0) break;
            pMVar6 = pMVar6->next;
            if ((pMVar6->entry_data).type != 2) goto LAB_001052d8;
            pcVar5 = mmdb_strndup((pMVar6->entry_data).field_1.utf8_string,
                                  (ulong)(pMVar6->entry_data).data_size);
            ppMVar3 = (mmdb->metadata).description.descriptions;
            ppMVar3[sVar7 - 1]->description = pcVar5;
            lVar1 = sVar7 - 1;
            sVar7 = sVar7 + 1;
            pMVar8 = local_80;
            local_88 = pMVar6;
          } while (ppMVar3[lVar1]->description != (char *)0x0);
        }
      }
      if (pMVar8 != (MMDB_entry_data_list_s *)0x0) {
        data_pool_destroy((MMDB_data_pool_s *)pMVar8->pool);
      }
    }
  }
  return iVar2;
}

Assistant:

static int populate_description_metadata(MMDB_s *mmdb,
                                         MMDB_s *metadata_db,
                                         MMDB_entry_s *metadata_start) {
    MMDB_entry_data_s entry_data;

    const char *path[] = {"description", NULL};
    int status = MMDB_aget_value(metadata_start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    if (MMDB_DATA_TYPE_MAP != entry_data.type) {
        DEBUG_MSGF("Unexpected entry_data type: %d", entry_data.type);
        return MMDB_INVALID_METADATA_ERROR;
    }

    MMDB_entry_s map_start = {.mmdb = metadata_db, .offset = entry_data.offset};

    MMDB_entry_data_list_s *member;
    status = MMDB_get_entry_data_list(&map_start, &member);
    if (MMDB_SUCCESS != status) {
        DEBUG_MSGF(
            "MMDB_get_entry_data_list failed while populating description."
            " status = %d (%s)",
            status,
            MMDB_strerror(status));
        return status;
    }

    MMDB_entry_data_list_s *first_member = member;

    uint32_t map_size = member->entry_data.data_size;
    mmdb->metadata.description.count = 0;
    if (0 == map_size) {
        mmdb->metadata.description.descriptions = NULL;
        goto cleanup;
    }
    MAYBE_CHECK_SIZE_OVERFLOW(map_size,
                              SIZE_MAX / sizeof(MMDB_description_s *),
                              MMDB_INVALID_METADATA_ERROR);

    mmdb->metadata.description.descriptions =
        calloc(map_size, sizeof(MMDB_description_s *));
    if (NULL == mmdb->metadata.description.descriptions) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    for (uint32_t i = 0; i < map_size; i++) {
        mmdb->metadata.description.descriptions[i] =
            calloc(1, sizeof(MMDB_description_s));
        if (NULL == mmdb->metadata.description.descriptions[i]) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.count = i + 1;
        mmdb->metadata.description.descriptions[i]->language = NULL;
        mmdb->metadata.description.descriptions[i]->description = NULL;

        member = member->next;

        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            status = MMDB_INVALID_METADATA_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.descriptions[i]->language = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.description.descriptions[i]->language) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }

        member = member->next;

        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            status = MMDB_INVALID_METADATA_ERROR;
            goto cleanup;
        }

        mmdb->metadata.description.descriptions[i]->description = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.description.descriptions[i]->description) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
            goto cleanup;
        }
    }

cleanup:
    MMDB_free_entry_data_list(first_member);

    return status;
}